

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS ref_recon_normal(REF_GRID ref_grid,REF_INT node,REF_DBL *normal)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  REF_DBL area;
  REF_DBL tri_norm [3];
  REF_INT nodes [27];
  double local_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  auVar11 = ZEXT816(0);
  *(undefined1 (*) [16])normal = auVar11;
  normal[2] = 0.0;
  dVar12 = 0.0;
  if ((node < 0) || (pRVar1 = ref_cell->ref_adj, pRVar1->nnode <= node)) {
    dVar15 = 0.0;
LAB_001c8ab1:
    dVar13 = dVar15 * 1e+20;
    if (dVar13 <= -dVar13) {
      dVar13 = -dVar13;
    }
    dVar10 = auVar11._0_8_;
    if (dVar10 <= -dVar10) {
      dVar10 = -dVar10;
    }
    dVar14 = auVar11._8_8_;
    if (dVar10 < dVar13) {
      if (dVar14 <= -dVar14) {
        dVar14 = -dVar14;
      }
      if (dVar14 < dVar13) {
        dVar10 = dVar12;
        if (dVar12 <= -dVar12) {
          dVar10 = -dVar12;
        }
        if (dVar10 < dVar13) {
          auVar3._8_8_ = dVar15;
          auVar3._0_8_ = dVar15;
          auVar11 = divpd(auVar11,auVar3);
          *(undefined1 (*) [16])normal = auVar11;
          normal[2] = dVar12 / dVar15;
          uVar4 = ref_math_normalize(normal);
          if (uVar4 == 0) {
            return 0;
          }
          uVar7 = (ulong)uVar4;
          pcVar8 = "norm";
          uVar5 = 0x5c5;
          goto LAB_001c8c87;
        }
      }
    }
    *normal = 0.0;
    normal[1] = 0.0;
    normal[2] = 0.0;
    RVar6 = 4;
  }
  else {
    lVar9 = (long)pRVar1->first[(uint)node];
    dVar15 = 0.0;
    if (lVar9 == -1) goto LAB_001c8ab1;
    uVar4 = ref_cell_nodes(ref_cell,pRVar1->item[lVar9].ref,local_a8);
    if (uVar4 == 0) {
      local_d8 = 0.0;
      uStack_d0 = 0;
      do {
        uVar4 = ref_node_tri_normal(ref_node,local_a8,&local_c8);
        if (uVar4 != 0) {
          uVar7 = (ulong)uVar4;
          pcVar8 = "cell nodes";
          uVar5 = 0x5b8;
          goto LAB_001c8c87;
        }
        uVar4 = ref_node_tri_area(ref_node,local_a8,&local_e0);
        if (uVar4 != 0) {
          uVar7 = (ulong)uVar4;
          pcVar8 = "area";
          uVar5 = 0x5b9;
          goto LAB_001c8c87;
        }
        auVar11._0_8_ = local_e0 * local_c8 + *normal;
        auVar11._8_8_ = local_e0 * dStack_c0 + normal[1];
        *(undefined1 (*) [16])normal = auVar11;
        dVar15 = local_d8 + local_e0;
        dVar12 = local_e0 * local_b8 + normal[2];
        normal[2] = dVar12;
        pRVar2 = ref_cell->ref_adj->item;
        lVar9 = (long)pRVar2[(int)lVar9].next;
        if (lVar9 == -1) goto LAB_001c8ab1;
        local_d8 = dVar15;
        uVar4 = ref_cell_nodes(ref_cell,pRVar2[lVar9].ref,local_a8);
      } while (uVar4 == 0);
    }
    uVar7 = (ulong)uVar4;
    pcVar8 = "cell nodes";
    uVar5 = 0x5b7;
LAB_001c8c87:
    RVar6 = (REF_STATUS)uVar7;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar5,
           "ref_recon_normal",uVar7,pcVar8);
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_recon_normal(REF_GRID ref_grid, REF_INT node,
                                    REF_DBL *normal) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL total, area, tri_norm[3];

  normal[0] = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  total = 0.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, tri_norm), "cell nodes");
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    normal[0] += area * tri_norm[0];
    normal[1] += area * tri_norm[1];
    normal[2] += area * tri_norm[2];
    total += area;
  }
  if (ref_math_divisible(normal[0], total) &&
      ref_math_divisible(normal[1], total) &&
      ref_math_divisible(normal[2], total)) {
    normal[0] /= total;
    normal[1] /= total;
    normal[2] /= total;
    RSS(ref_math_normalize(normal), "norm");
  } else {
    normal[0] = 0.0;
    normal[1] = 0.0;
    normal[2] = 0.0;
    return REF_DIV_ZERO;
  }
  return REF_SUCCESS;
}